

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * ApprovalTests::ApprovalTestNamer::getMisconfiguredMainHelp_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  HelpMessages::getMisconfiguredMainHelp_abi_cxx11_();
  ::std::operator+(&local_50,"\n\n",&local_30);
  ::std::operator+(in_RDI,&local_50,"\n\n");
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getMisconfiguredMainHelp()
    {
        return "\n\n" + HelpMessages::getMisconfiguredMainHelp() + "\n\n";
    }